

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDbvt.h
# Opt level: O2

void __thiscall cbtDbvtAabbMm::SignedExpand(cbtDbvtAabbMm *this,cbtVector3 *e)

{
  float fVar1;
  
  fVar1 = e->m_floats[0];
  (&this->mi)[0.0 < fVar1].m_floats[0] = fVar1 + (&this->mi)[0.0 < fVar1].m_floats[0];
  fVar1 = e->m_floats[1];
  (&this->mi)[0.0 < fVar1].m_floats[1] = fVar1 + (&this->mi)[0.0 < fVar1].m_floats[1];
  fVar1 = e->m_floats[2];
  (&this->mi)[0.0 < fVar1].m_floats[2] = fVar1 + (&this->mi)[0.0 < fVar1].m_floats[2];
  return;
}

Assistant:

DBVT_INLINE void cbtDbvtAabbMm::SignedExpand(const cbtVector3& e)
{
	if (e.x() > 0)
		mx.setX(mx.x() + e[0]);
	else
		mi.setX(mi.x() + e[0]);
	if (e.y() > 0)
		mx.setY(mx.y() + e[1]);
	else
		mi.setY(mi.y() + e[1]);
	if (e.z() > 0)
		mx.setZ(mx.z() + e[2]);
	else
		mi.setZ(mi.z() + e[2]);
}